

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx512_gemm.h
# Opt level: O3

void intgemm::AVX512BW::Kernels8::Quantize(float *input,int8_t *output,float quant_mult,Index size)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 in_register_00001204 [60];
  
  auVar22._4_60_ = in_register_00001204;
  auVar22._0_4_ = quant_mult;
  auVar22 = vbroadcastss_avx512f(auVar22._0_16_);
  uVar18 = (ulong)size & 0xfffffff0;
  if ((size & 0xfffffff0) != 0) {
    uVar20 = 0;
    auVar23 = vpbroadcastd_avx512f(ZEXT416(0xffffff81));
    do {
      auVar24 = vmulps_avx512f(auVar22,*(undefined1 (*) [64])(input + uVar20));
      auVar24 = vcvtps2dq_avx512f(auVar24);
      auVar24 = vpmaxsd_avx512f(auVar24,auVar23);
      auVar21 = vpmovsdb_avx512f(auVar24);
      *(undefined1 (*) [16])(output + uVar20) = auVar21;
      uVar20 = uVar20 + 0x10;
    } while (uVar20 < uVar18);
  }
  if ((size & 0xf) != 0) {
    auVar22 = vmulps_avx512f(auVar22,*(undefined1 (*) [64])(input + uVar18));
    auVar22 = vcvtps2dq_avx512f(auVar22);
    auVar23._8_4_ = 0xffffff81;
    auVar23._0_8_ = 0xffffff81ffffff81;
    auVar23._12_4_ = 0xffffff81;
    auVar23._16_4_ = 0xffffff81;
    auVar23._20_4_ = 0xffffff81;
    auVar23._24_4_ = 0xffffff81;
    auVar23._28_4_ = 0xffffff81;
    auVar23._32_4_ = 0xffffff81;
    auVar23._36_4_ = 0xffffff81;
    auVar23._40_4_ = 0xffffff81;
    auVar23._44_4_ = 0xffffff81;
    auVar23._48_4_ = 0xffffff81;
    auVar23._52_4_ = 0xffffff81;
    auVar23._56_4_ = 0xffffff81;
    auVar23._60_4_ = 0xffffff81;
    auVar22 = vpmaxsd_avx512f(auVar22,auVar23);
    uVar19 = ~(-1 << ((byte)size & 0xf));
    pbVar1 = (byte *)(output + uVar18);
    auVar21 = vpmovsdb_avx512f(auVar22);
    bVar2 = (bool)((byte)uVar19 & 1);
    bVar3 = (bool)((byte)(uVar19 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar19 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar19 >> 3) & 1);
    bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
    bVar7 = (bool)((byte)(uVar19 >> 5) & 1);
    bVar8 = (bool)((byte)(uVar19 >> 6) & 1);
    bVar9 = (bool)((byte)(uVar19 >> 7) & 1);
    bVar10 = (bool)((byte)(uVar19 >> 8) & 1);
    bVar11 = (bool)((byte)(uVar19 >> 9) & 1);
    bVar12 = (bool)((byte)(uVar19 >> 10) & 1);
    bVar13 = (bool)((byte)(uVar19 >> 0xb) & 1);
    bVar14 = (bool)((byte)(uVar19 >> 0xc) & 1);
    bVar15 = (bool)((byte)(uVar19 >> 0xd) & 1);
    bVar16 = (bool)((byte)(uVar19 >> 0xe) & 1);
    bVar17 = (bool)((byte)(uVar19 >> 0xf) & 1);
    *pbVar1 = bVar2 * auVar21[0] | !bVar2 * *pbVar1;
    pbVar1[1] = bVar3 * auVar21[1] | !bVar3 * pbVar1[1];
    pbVar1[2] = bVar4 * auVar21[2] | !bVar4 * pbVar1[2];
    pbVar1[3] = bVar5 * auVar21[3] | !bVar5 * pbVar1[3];
    pbVar1[4] = bVar6 * auVar21[4] | !bVar6 * pbVar1[4];
    pbVar1[5] = bVar7 * auVar21[5] | !bVar7 * pbVar1[5];
    pbVar1[6] = bVar8 * auVar21[6] | !bVar8 * pbVar1[6];
    pbVar1[7] = bVar9 * auVar21[7] | !bVar9 * pbVar1[7];
    pbVar1[8] = bVar10 * auVar21[8] | !bVar10 * pbVar1[8];
    pbVar1[9] = bVar11 * auVar21[9] | !bVar11 * pbVar1[9];
    pbVar1[10] = bVar12 * auVar21[10] | !bVar12 * pbVar1[10];
    pbVar1[0xb] = bVar13 * auVar21[0xb] | !bVar13 * pbVar1[0xb];
    pbVar1[0xc] = bVar14 * auVar21[0xc] | !bVar14 * pbVar1[0xc];
    pbVar1[0xd] = bVar15 * auVar21[0xd] | !bVar15 * pbVar1[0xd];
    pbVar1[0xe] = bVar16 * auVar21[0xe] | !bVar16 * pbVar1[0xe];
    pbVar1[0xf] = bVar17 * auVar21[0xf] | !bVar17 * pbVar1[0xf];
  }
  return;
}

Assistant:

INTGEMM_AVX512BW static void Quantize(const float *input, int8_t *output, float quant_mult, Index size) {
    assert(reinterpret_cast<uintptr_t>(input) % sizeof(__m512i) == 0);
    const std::size_t kBatch = sizeof(__m512i) / sizeof(float);
    std::size_t fast_size = (size & ~(kBatch - 1));
    const float *fast_input_end = input + fast_size;
    int8_t *fast_output_end = output + fast_size;
#pragma omp parallel
    {
      QuantizeThread(input, output, quant_mult, fast_size);
    }
    std::size_t overhang = size & (kBatch - 1);
    if (!overhang) return; // We needed a branch anyway for the empty case.
    const __m512i neg127 = _mm512_set1_epi32(-127);
    const __m512 quant_mult_reg = _mm512_set1_ps(quant_mult);
    __m512i asint = QuantizerGrab(fast_input_end, quant_mult_reg);
    asint = _mm512_max_epi32(asint, neg127);
    _mm512_mask_cvtsepi32_storeu_epi8(fast_output_end, (1 << overhang) - 1, asint);
  }